

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false>::
visit<slang::ast::UniquenessConstraint>
          (ASTVisitor<slang::ast::CheckerMemberVisitor,_true,_true,_false,_false> *this,
          UniquenessConstraint *t)

{
  if ((t->super_Constraint).kind != Invalid) {
    UniquenessConstraint::visitExprs<slang::ast::CheckerMemberVisitor&>
              (t,(CheckerMemberVisitor *)this);
    return;
  }
  return;
}

Assistant:

bool bad() const { return kind == ConstraintKind::Invalid; }